

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_in::iterate(TessellationShaderTCTEgl_in *this)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar6;
  size_t sVar7;
  MessageBuilder *this_00;
  TestError *pTVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  GLint expected_value_int [4];
  GLfloat expected_value_float [4];
  string name;
  int local_228 [4];
  TessellationShaderTCTEgl_in *local_218;
  float local_20c;
  float local_208 [6];
  long *local_1f0 [2];
  long local_1e0 [2];
  long local_1d0;
  ulong local_1c8;
  long local_1c0;
  long *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  initTest(this);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar10 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x62a);
  (**(code **)(lVar10 + 0x1680))(this->m_po_id);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x630);
  (**(code **)(lVar10 + 0x5e0))(0x8c89);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x633);
  uVar11 = 0;
  (**(code **)(lVar10 + 0x30))(0);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glBeginTransformFeedback(GL_POINTS) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x636);
  local_218 = this;
  (**(code **)(lVar10 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63a);
  (**(code **)(lVar10 + 0x638))();
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63d);
  lVar6 = (**(code **)(lVar10 + 0xd00))(0x8c8e,0,0x160,1);
  local_1d0 = lVar10;
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glMapBufferRange() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x648);
  do {
    lVar10 = 0;
    local_1c8 = uVar11;
    do {
      lVar9 = lVar6;
      local_208[0] = 0.0;
      local_208[1] = 0.0;
      local_208[2] = 0.0;
      local_208[3] = 0.0;
      local_228[0] = 0;
      local_228[1] = 0;
      local_228[2] = 0;
      local_228[3] = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,getXFBProperties::xfb_varyings[lVar10],
                 (allocator<char> *)local_1b0);
      iVar4 = std::__cxx11::string::compare((char *)local_1f0);
      local_1c0 = lVar10;
      if (iVar4 == 0) {
        local_208[0] = 22.0;
LAB_00d4fbdd:
        bVar1 = true;
        lVar6 = 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_1f0);
        if (iVar4 == 0) {
          local_228[0] = 0x17;
LAB_00d4fbf0:
          lVar6 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_1f0);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)local_1f0);
            if (iVar4 == 0) {
              local_208[0] = 27.0;
              local_208[1] = 28.0;
              local_208[2] = 29.0;
              local_208[3] = 30.0;
LAB_00d4fe07:
              bVar1 = true;
              lVar6 = 4;
              goto LAB_00d4fc17;
            }
            iVar4 = std::__cxx11::string::compare((char *)local_1f0);
            if (iVar4 == 0) {
              local_228[0] = 0x26;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_1f0);
              if (iVar4 == 0) {
                local_208[0] = 39.0;
                goto LAB_00d4fbdd;
              }
              iVar4 = std::__cxx11::string::compare((char *)local_1f0);
              if (iVar4 != 0) {
                iVar4 = std::__cxx11::string::compare((char *)local_1f0);
                if (iVar4 == 0) {
                  local_228[0] = 0x20;
                  local_228[1] = 0x21;
                  lVar6 = 2;
                  goto LAB_00d4fc15;
                }
                iVar4 = std::__cxx11::string::compare((char *)local_1f0);
                if (iVar4 == 0) {
                  local_208[0] = 34.0;
                  local_208[1] = 35.0;
                  local_208[2] = 36.0;
                  local_208[3] = 37.0;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_1f0);
                  if (iVar4 != 0) {
                    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar8,"Unrecognized XFB name",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                               ,0x6ab);
                    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  local_208[0] = 5.0;
                  local_208[1] = 6.0;
                  local_208[2] = 7.0;
                  local_208[3] = 8.0;
                }
                goto LAB_00d4fe07;
              }
              local_228[0] = 0x1f;
            }
            goto LAB_00d4fbf0;
          }
          local_228[0] = 0x18;
          local_228[1] = 0x19;
          local_228[2] = 0x1a;
          lVar6 = 3;
        }
LAB_00d4fc15:
        bVar1 = false;
      }
LAB_00d4fc17:
      lVar12 = 0;
      lVar10 = 0;
      do {
        if (bVar1) {
          local_20c = local_208[lVar10];
          fVar13 = *(float *)(lVar9 + lVar10 * 4) - local_208[lVar10];
          fVar14 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar14 = fVar13;
          }
          if (1e-05 < fVar14) {
            local_1b0 = (undefined1  [8])
                        ((local_218->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid component at index [",0x1c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(found:",7);
            std::ostream::_M_insert<double>((double)*(float *)(lVar9 + lVar10 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," expected:",10)
            ;
            std::ostream::_M_insert<double>((double)local_20c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,") for varying [",0xf);
            plVar2 = local_1f0[0];
            if (local_1f0[0] == (long *)0x0) {
              std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
            }
            else {
              sVar7 = strlen((char *)local_1f0[0]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)plVar2,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
        }
        else {
          iVar4 = local_228[lVar10];
          if (*(int *)(lVar9 + lVar10 * 4) != iVar4) {
            local_1b0 = (undefined1  [8])
                        ((local_218->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid component at index [",0x1c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(found:",7);
            std::ostream::operator<<((ostringstream *)local_1a8,*(int *)(lVar9 + lVar10 * 4));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," expected:",10)
            ;
            std::ostream::operator<<((ostringstream *)local_1a8,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,") for varying [",0xf);
            local_1b8 = local_1f0[0];
            this_00 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,(char **)&local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]",1);
            tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Invalid rendered value",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                       ,0x6d3);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + -4;
      } while (lVar6 != lVar10);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0],local_1e0[0] + 1);
      }
      lVar3 = local_1d0;
      lVar10 = local_1c0 + 1;
      lVar6 = lVar9 - lVar12;
    } while (lVar10 != 10);
    lVar6 = lVar9 - lVar12;
    uVar11 = (ulong)((int)local_1c8 + 1);
    if ((int)local_1c8 != 0) {
      (**(code **)(local_1d0 + 0x1670))(0x8c8e);
      dVar5 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x6e7);
      tcu::TestContext::setTestResult
                ((local_218->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_in::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Render the geometry. We're only interested in XFB data, not the visual outcome,
	 * so disable rasterization before we fire a draw call.
	 */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) call failed");
	{
		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Download the data we stored with TF */
	glw::GLint			n_xfb_names   = 0;
	void*				rendered_data = NULL;
	const glw::GLchar** xfb_names	 = NULL;
	glw::GLint			xfb_size	  = 0;

	getXFBProperties(&xfb_names, &n_xfb_names, &xfb_size);

	rendered_data = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, xfb_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	/* Move through the result buffer and make sure the values we retrieved are valid.
	 * Note that two points will be generated by the tessellator, so run the checks
	 * twice.
	 */
	typedef enum {
		XFB_VARYING_TYPE_FLOAT,
		XFB_VARYING_TYPE_INT,

		XFB_VARYING_TYPE_UNKNOWN
	} _xfb_varying_type;

	unsigned char* traveller_ptr = (unsigned char*)rendered_data;

	for (glw::GLint n_point = 0; n_point < 2 /* points */; ++n_point)
	{
		for (glw::GLint n_xfb_name = 0; n_xfb_name < n_xfb_names; ++n_xfb_name)
		{
			glw::GLfloat	  expected_value_float[4] = { 0.0f };
			glw::GLint		  expected_value_int[4]   = { 0 };
			std::string		  name					  = xfb_names[n_xfb_name];
			unsigned int	  n_varying_components	= 0;
			_xfb_varying_type varying_type			  = XFB_VARYING_TYPE_UNKNOWN;

			if (name.compare("result_float") == 0)
			{
				expected_value_float[0] = 22.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_int") == 0)
			{
				expected_value_int[0] = 23;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_ivec3") == 0)
			{
				expected_value_int[0] = 24;
				expected_value_int[1] = 25;
				expected_value_int[2] = 26;
				n_varying_components  = 3;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_mat2") == 0)
			{
				expected_value_float[0] = 27.0f;
				expected_value_float[1] = 28.0f;
				expected_value_float[2] = 29.0f;
				expected_value_float[3] = 30.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_struct_test1") == 0)
			{
				expected_value_int[0] = 38;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_struct_test2") == 0)
			{
				expected_value_float[0] = 39.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_uint") == 0)
			{
				expected_value_int[0] = 31;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_uvec2") == 0)
			{
				expected_value_int[0] = 32;
				expected_value_int[1] = 33;
				n_varying_components  = 2;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_vec4") == 0)
			{
				expected_value_float[0] = 34.0f;
				expected_value_float[1] = 35.0f;
				expected_value_float[2] = 36.0f;
				expected_value_float[3] = 37.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("gl_Position") == 0)
			{
				expected_value_float[0] = 5.0f;
				expected_value_float[1] = 6.0f;
				expected_value_float[2] = 7.0f;
				expected_value_float[3] = 8.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else
			{
				TCU_FAIL("Unrecognized XFB name");
			}

			/* Move through the requested amount of components and perform type-specific
			 * comparison.
			 */
			const float epsilon = (float)1e-5;

			for (unsigned int n_component = 0; n_component < n_varying_components; ++n_component)
			{
				switch (varying_type)
				{
				case XFB_VARYING_TYPE_FLOAT:
				{
					glw::GLfloat* rendered_value = (glw::GLfloat*)traveller_ptr;

					if (de::abs(*rendered_value - expected_value_float[n_component]) > epsilon)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_float[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;
					}

					traveller_ptr += sizeof(glw::GLfloat);

					break;
				}

				case XFB_VARYING_TYPE_INT:
				{
					glw::GLint* rendered_value = (glw::GLint*)traveller_ptr;

					if (*rendered_value != expected_value_int[n_component])
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_int[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid rendered value");
					}

					traveller_ptr += sizeof(glw::GLint);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized varying type");
				}
				} /* switch(varying_type) */

			} /* for (all components) */
		}	 /* for (all XFBed variables) */
	}		  /* for (both points) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}